

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O1

Test * __thiscall
testing::internal::
ParameterizedTestFactory<(anonymous_namespace)::LowPrecisionQuantizeTest_MultipleQ_Test>::CreateTest
          (ParameterizedTestFactory<(anonymous_namespace)::LowPrecisionQuantizeTest_MultipleQ_Test>
           *this)

{
  Test *this_00;
  ParamType *pPVar1;
  
  WithParamInterface<std::tuple<void(*)(short_const*,long,short_const*,short_const*,short*,short*,short_const*,unsigned_short*,short_const*,short_const*),void(*)(short_const*,long,short_const*,short_const*,short*,short*,short_const*,unsigned_short*,short_const*,short_const*),unsigned_char,(anonymous_namespace)::QuantType,aom_bit_depth>>
  ::parameter_ = &this->parameter_;
  this_00 = (Test *)operator_new(0x50);
  Test::Test(this_00);
  this_00->_vptr_Test = (_func_int **)&PTR__TestWithParam_010c7018;
  this_00[1]._vptr_Test = (_func_int **)&PTR__QuantizeTestBase_010c7060;
  *(undefined4 *)
   &this_00[1].gtest_flag_saver_._M_t.
    super___uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
    ._M_t.
    super__Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
    .super__Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>._M_head_impl = 0xbaba;
  pPVar1 = WithParamInterface<std::tuple<void_(*)(const_short_*,_long,_const_short_*,_const_short_*,_short_*,_short_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_void_(*)(const_short_*,_long,_const_short_*,_const_short_*,_short_*,_short_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_unsigned_char,_(anonymous_namespace)::QuantType,_aom_bit_depth>_>
           ::GetParam();
  this_00[3]._vptr_Test =
       (_func_int **)
       (pPVar1->
       super__Tuple_impl<0UL,_void_(*)(const_short_*,_long,_const_short_*,_const_short_*,_short_*,_short_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_void_(*)(const_short_*,_long,_const_short_*,_const_short_*,_short_*,_short_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_unsigned_char,_(anonymous_namespace)::QuantType,_aom_bit_depth>
       ).
       super__Head_base<0UL,_void_(*)(const_short_*,_long,_const_short_*,_const_short_*,_short_*,_short_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_false>
       ._M_head_impl;
  pPVar1 = WithParamInterface<std::tuple<void_(*)(const_short_*,_long,_const_short_*,_const_short_*,_short_*,_short_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_void_(*)(const_short_*,_long,_const_short_*,_const_short_*,_short_*,_short_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_unsigned_char,_(anonymous_namespace)::QuantType,_aom_bit_depth>_>
           ::GetParam();
  this_00[3].gtest_flag_saver_._M_t.
  super___uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
  .super__Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>._M_head_impl =
       (GTestFlagSaver *)
       (pPVar1->
       super__Tuple_impl<0UL,_void_(*)(const_short_*,_long,_const_short_*,_const_short_*,_short_*,_short_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_void_(*)(const_short_*,_long,_const_short_*,_const_short_*,_short_*,_short_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_unsigned_char,_(anonymous_namespace)::QuantType,_aom_bit_depth>
       ).
       super__Tuple_impl<1UL,_void_(*)(const_short_*,_long,_const_short_*,_const_short_*,_short_*,_short_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_unsigned_char,_(anonymous_namespace)::QuantType,_aom_bit_depth>
       .
       super__Head_base<1UL,_void_(*)(const_short_*,_long,_const_short_*,_const_short_*,_short_*,_short_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_false>
       ._M_head_impl;
  pPVar1 = WithParamInterface<std::tuple<void_(*)(const_short_*,_long,_const_short_*,_const_short_*,_short_*,_short_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_void_(*)(const_short_*,_long,_const_short_*,_const_short_*,_short_*,_short_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_unsigned_char,_(anonymous_namespace)::QuantType,_aom_bit_depth>_>
           ::GetParam();
  *(uchar *)&this_00[4]._vptr_Test =
       (pPVar1->
       super__Tuple_impl<0UL,_void_(*)(const_short_*,_long,_const_short_*,_const_short_*,_short_*,_short_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_void_(*)(const_short_*,_long,_const_short_*,_const_short_*,_short_*,_short_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_unsigned_char,_(anonymous_namespace)::QuantType,_aom_bit_depth>
       ).
       super__Tuple_impl<1UL,_void_(*)(const_short_*,_long,_const_short_*,_const_short_*,_short_*,_short_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_unsigned_char,_(anonymous_namespace)::QuantType,_aom_bit_depth>
       .super__Tuple_impl<2UL,_unsigned_char,_(anonymous_namespace)::QuantType,_aom_bit_depth>.
       super__Head_base<2UL,_unsigned_char,_false>._M_head_impl;
  pPVar1 = WithParamInterface<std::tuple<void_(*)(const_short_*,_long,_const_short_*,_const_short_*,_short_*,_short_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_void_(*)(const_short_*,_long,_const_short_*,_const_short_*,_short_*,_short_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_unsigned_char,_(anonymous_namespace)::QuantType,_aom_bit_depth>_>
           ::GetParam();
  *(QuantType *)((long)&this_00[4]._vptr_Test + 4) =
       (pPVar1->
       super__Tuple_impl<0UL,_void_(*)(const_short_*,_long,_const_short_*,_const_short_*,_short_*,_short_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_void_(*)(const_short_*,_long,_const_short_*,_const_short_*,_short_*,_short_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_unsigned_char,_(anonymous_namespace)::QuantType,_aom_bit_depth>
       ).
       super__Tuple_impl<1UL,_void_(*)(const_short_*,_long,_const_short_*,_const_short_*,_short_*,_short_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_unsigned_char,_(anonymous_namespace)::QuantType,_aom_bit_depth>
       .super__Tuple_impl<2UL,_unsigned_char,_(anonymous_namespace)::QuantType,_aom_bit_depth>.
       super__Tuple_impl<3UL,_(anonymous_namespace)::QuantType,_aom_bit_depth>.
       super__Head_base<3UL,_(anonymous_namespace)::QuantType,_false>._M_head_impl;
  pPVar1 = WithParamInterface<std::tuple<void_(*)(const_short_*,_long,_const_short_*,_const_short_*,_short_*,_short_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_void_(*)(const_short_*,_long,_const_short_*,_const_short_*,_short_*,_short_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_unsigned_char,_(anonymous_namespace)::QuantType,_aom_bit_depth>_>
           ::GetParam();
  *(aom_bit_depth *)
   &this_00[4].gtest_flag_saver_._M_t.
    super___uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
    ._M_t.
    super__Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
    .super__Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>._M_head_impl =
       (pPVar1->
       super__Tuple_impl<0UL,_void_(*)(const_short_*,_long,_const_short_*,_const_short_*,_short_*,_short_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_void_(*)(const_short_*,_long,_const_short_*,_const_short_*,_short_*,_short_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_unsigned_char,_(anonymous_namespace)::QuantType,_aom_bit_depth>
       ).
       super__Tuple_impl<1UL,_void_(*)(const_short_*,_long,_const_short_*,_const_short_*,_short_*,_short_*,_const_short_*,_unsigned_short_*,_const_short_*,_const_short_*),_unsigned_char,_(anonymous_namespace)::QuantType,_aom_bit_depth>
       .super__Tuple_impl<2UL,_unsigned_char,_(anonymous_namespace)::QuantType,_aom_bit_depth>.
       super__Tuple_impl<3UL,_(anonymous_namespace)::QuantType,_aom_bit_depth>.
       super__Tuple_impl<4UL,_aom_bit_depth>.super__Head_base<4UL,_aom_bit_depth,_false>.
       _M_head_impl;
  this_00->_vptr_Test = (_func_int **)&PTR__TestWithParam_010c7480;
  this_00[1]._vptr_Test = (_func_int **)&PTR__LowPrecisionQuantizeTest_MultipleQ_Test_010c74c8;
  return this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }